

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_attrib.cc
# Opt level: O2

X509_ATTRIBUTE * X509_ATTRIBUTE_create(int nid,int atrtype,void *value)

{
  ASN1_OBJECT *pAVar1;
  X509_ATTRIBUTE *a;
  ASN1_TYPE *a_00;
  size_t sVar2;
  
  pAVar1 = OBJ_nid2obj(nid);
  if (pAVar1 != (ASN1_OBJECT *)0x0) {
    a = X509_ATTRIBUTE_new();
    a_00 = ASN1_TYPE_new();
    if (a_00 != (ASN1_TYPE *)0x0 && a != (X509_ATTRIBUTE *)0x0) {
      a->object = pAVar1;
      sVar2 = OPENSSL_sk_push(*(OPENSSL_STACK **)&a->single,a_00);
      if (sVar2 != 0) {
        ASN1_TYPE_set(a_00,atrtype,value);
        return a;
      }
    }
    X509_ATTRIBUTE_free(a);
    ASN1_TYPE_free(a_00);
  }
  return (X509_ATTRIBUTE *)0x0;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create(int nid, int attrtype, void *value) {
  ASN1_OBJECT *obj = OBJ_nid2obj(nid);
  if (obj == NULL) {
    return NULL;
  }

  X509_ATTRIBUTE *ret = X509_ATTRIBUTE_new();
  ASN1_TYPE *val = ASN1_TYPE_new();
  if (ret == NULL || val == NULL) {
    goto err;
  }

  ret->object = obj;
  if (!sk_ASN1_TYPE_push(ret->set, val)) {
    goto err;
  }

  ASN1_TYPE_set(val, attrtype, value);
  return ret;

err:
  X509_ATTRIBUTE_free(ret);
  ASN1_TYPE_free(val);
  return NULL;
}